

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O3

void applyPatches(Section *section,void *arg)

{
  int iVar1;
  Section **ppSVar2;
  long lVar3;
  Patch *patch;
  Patch *pPVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  int iVar8;
  Section *pSVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (section->type == SECTTYPE_INVALID) {
    __assert_fail("type != SECTTYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                  ,0x65,"bool sect_HasData(enum SectionType)");
  }
  pSVar9 = section;
  if ((section->type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX) {
    do {
      if (beVerbose == true) {
        applyPatches();
      }
      if (pSVar9->nbPatches != 0) {
        uVar11 = 0;
        do {
          pPVar4 = pSVar9->patches;
          patch = pPVar4 + uVar11;
          uVar5 = computeRPNExpr(patch,pSVar9->fileSymbols);
          uVar7 = pSVar9->offset + (short)pPVar4[uVar11].offset;
          uVar6 = (ulong)pPVar4[uVar11].type;
          if (uVar6 == 3) {
            iVar8 = uVar5 - (ushort)(patch->pcSection->org + (short)patch->pcOffset);
            iVar1 = iVar8 + -2;
            if ((isError == false) && (0xff < (iVar8 + 0x7eU & 0xffff))) {
              error(patch->src,patch->lineNo,"jr target out of reach (expected -129 < %d < 128)",
                    (ulong)(uint)(int)(short)iVar1);
            }
            section->data[uVar7] = (uint8_t)iVar1;
          }
          else {
            if (isError == false) {
              lVar3 = uVar6 * 0xc;
              if (((int)uVar5 < *(int *)(&DAT_0010d954 + lVar3)) ||
                 (*(int *)(&DAT_0010d958 + lVar3) < (int)uVar5)) {
                pcVar10 = "";
                if ((int)uVar5 < 0) {
                  pcVar10 = " (maybe negative?)";
                }
                error(patch->src,patch->lineNo,"Value %d%s is not %u-bit",(ulong)uVar5,pcVar10,
                      (ulong)(byte)(&DAT_0010d950)[lVar3] << 3);
                uVar6 = (ulong)patch->type;
              }
            }
            if ((&DAT_0010d950)[uVar6 * 0xc] != '\0') {
              uVar6 = 0;
              do {
                section->data[uVar6 + uVar7] = (uint8_t)uVar5;
                uVar5 = (int)uVar5 >> 8;
                uVar6 = uVar6 + 1;
              } while (uVar6 < (byte)(&DAT_0010d950)[(ulong)patch->type * 0xc]);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < pSVar9->nbPatches);
      }
      ppSVar2 = &pSVar9->nextu;
      pSVar9 = *ppSVar2;
    } while (*ppSVar2 != (Section *)0x0);
  }
  return;
}

Assistant:

static void applyPatches(struct Section *section, void *arg)
{
	if (!sect_HasData(section->type))
		return;

	(void)arg;
	struct Section *dataSection = section;

	do {
		applyFilePatches(section, dataSection);
		section = section->nextu;
	} while (section);
}